

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

size_t despace64(char *bytes,size_t howmany)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  int k;
  long lVar6;
  
  sVar3 = 0;
  pcVar5 = bytes;
  for (uVar4 = 0; (uVar4 | 7) < howmany; uVar4 = uVar4 + 8) {
    uVar2 = *(ulong *)(bytes + uVar4);
    if ((((~(0x101010101010100 - (uVar2 ^ 0xd0d0d0d0d0d0d0d) | uVar2) & 0x8080808080808080) == 0) &&
        ((~(0x101010101010100 - (uVar2 ^ 0xa0a0a0a0a0a0a0a) | uVar2) & 0x8080808080808080) == 0)) &&
       ((~(0x101010101010100 - (uVar2 ^ 0x2020202020202020) | uVar2) & 0x8080808080808080) == 0)) {
      *(ulong *)(bytes + sVar3) = uVar2;
      sVar3 = sVar3 + 8;
    }
    else {
      for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
        bVar1 = pcVar5[lVar6];
        if ((0x20 < (ulong)bVar1) || ((0x100002400U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
          bytes[sVar3] = bVar1;
          sVar3 = sVar3 + 1;
        }
      }
    }
    pcVar5 = pcVar5 + 8;
  }
  for (; uVar4 < howmany; uVar4 = uVar4 + 1) {
    bVar1 = bytes[uVar4];
    if ((0x20 < (ulong)bVar1) || ((0x100002400U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
      bytes[sVar3] = bVar1;
      sVar3 = sVar3 + 1;
    }
  }
  return sVar3;
}

Assistant:

size_t despace64(char *bytes, size_t howmany) {
  size_t pos = 0;
  size_t i = 0;
  uint64_t word = 0;
  uint64_t mask1 = ~UINT64_C(0) / 255 * (uint64_t)('\r');
  uint64_t mask2 = ~UINT64_C(0) / 255 * (uint64_t)('\n');
  uint64_t mask3 = ~UINT64_C(0) / 255 * (uint64_t)(' ');

  for (; i + 7 < howmany; i += 8) {
    memcpy(&word, bytes + i, sizeof(word));
    uint64_t xor1 = word ^ mask1;
    uint64_t xor2 = word ^ mask2;
    uint64_t xor3 = word ^ mask3;

    if (haszero(xor1) || haszero(xor2) || haszero(xor3)) {
      for (int k = 0; k < 8; k++) {
        char c = bytes[i + k];
        if (c == '\r' || c == '\n' || c == ' ') {
          continue;
        }
        bytes[pos++] = c;
      }

    } else {
      memmove(bytes + pos, bytes + i, sizeof(word));
      pos += 8;
    }
  }

  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}